

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<unsigned_int>,testing::Matcher<unsigned_char>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>,testing::Matcher<std::__cxx11::string_const&>>,std::tuple<unsigned_int,unsigned_char,std::chrono::duration<long,std::ratio<1l,1000l>>,std::__cxx11::string_const&>>
               (tuple<testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                *matcher_tuple,
               tuple<unsigned_int,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *value_tuple)

{
  element_type *peVar1;
  element_type *peVar2;
  char cVar3;
  undefined1 uVar4;
  
  peVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
           ).super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
           super_MatcherBase<unsigned_int>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  cVar3 = (**(code **)(*(long *)peVar1 + 0x20))
                    (peVar1,&(value_tuple->
                             super__Tuple_impl<0UL,_unsigned_int,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                             ).
                             super__Tuple_impl<1UL,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                             .field_0x14);
  if (cVar3 == '\0') {
    uVar4 = 0;
  }
  else {
    peVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             ).
             super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             .super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
             super_MatcherBase<unsigned_char>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar4 = (**(code **)(*(long *)peVar2 + 0x20))
                      (peVar2,&(value_tuple->
                               super__Tuple_impl<0UL,_unsigned_int,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                               ).
                               super__Tuple_impl<1UL,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                               .super__Head_base<1UL,_unsigned_char,_false>);
  }
  return (bool)uVar4;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }